

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

void __thiscall Logger::queueError(Logger *this,ErrorType type,string_view text)

{
  QueueEntry entry;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  string local_30;
  
  if (suppressLevel == 0) {
    local_58._0_4_ = SUB84(this,0);
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    formatError_abi_cxx11_
              (&local_30,(Logger *)((ulong)this & 0xffffffff),(ErrorType)text._M_len,text._M_str);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    std::vector<Logger::QueueEntry,_std::allocator<Logger::QueueEntry>_>::push_back
              (&queue,(value_type *)local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void Logger::queueError(ErrorType type, const std::string_view text)
{
	if (suppressLevel)
		return;

	QueueEntry entry;
	entry.type = type;
	entry.text = formatError(type,text.data());
	queue.push_back(entry);
}